

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

_Bool bitset_trim(bitset_t *bitset)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  uint64_t *puVar4;
  long lVar5;
  _Bool _Var6;
  
  sVar1 = bitset->arraysize;
  lVar2 = bitset->arraysize * -8;
  do {
    lVar5 = lVar2;
    sVar3 = sVar1;
    if (sVar3 == 0) break;
    sVar1 = sVar3 - 1;
    lVar2 = lVar5 + 8;
  } while (bitset->array[sVar3 - 1] == 0);
  _Var6 = true;
  if (bitset->capacity != sVar3) {
    puVar4 = (uint64_t *)roaring_realloc(bitset->array,-lVar5);
    if (puVar4 == (uint64_t *)0x0) {
      _Var6 = false;
    }
    else {
      bitset->array = puVar4;
      bitset->capacity = sVar3;
      bitset->arraysize = sVar3;
    }
  }
  return _Var6;
}

Assistant:

bool bitset_trim(bitset_t *bitset) {
    size_t newsize = bitset->arraysize;
    while (newsize > 0) {
        if (bitset->array[newsize - 1] == 0)
            newsize -= 1;
        else
            break;
    }
    if (bitset->capacity == newsize) return true;  // nothing to do
    uint64_t *newarray;
    if ((newarray = (uint64_t *)roaring_realloc(
             bitset->array, sizeof(uint64_t) * newsize)) == NULL) {
        return false;
    }
    bitset->array = newarray;
    bitset->capacity = newsize;
    bitset->arraysize = newsize;
    return true;
}